

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O1

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::Decoder::DecodeMeshFromBuffer
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,Decoder *this,DecoderBuffer *in_buffer)

{
  Mesh *this_00;
  Status _local_status;
  Status local_48;
  
  this_00 = (Mesh *)operator_new(0xd8);
  Mesh::Mesh(this_00);
  DecodeBufferToGeometry(&local_48,this,in_buffer,this_00);
  if (local_48.code_ == OK) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.error_msg_._M_dataplus._M_p != &local_48.error_msg_.field_2) {
      operator_delete(local_48.error_msg_._M_dataplus._M_p,
                      local_48.error_msg_.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->status_).code_ = OK;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
    (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = this_00;
    this_00 = (Mesh *)0x0;
  }
  else {
    (__return_storage_ptr__->status_).code_ = local_48.code_;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,
               local_48.error_msg_._M_dataplus._M_p,
               local_48.error_msg_._M_dataplus._M_p + local_48.error_msg_._M_string_length);
    (__return_storage_ptr__->value_)._M_t.
    super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
    super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
    super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.error_msg_._M_dataplus._M_p != &local_48.error_msg_.field_2) {
      operator_delete(local_48.error_msg_._M_dataplus._M_p,
                      local_48.error_msg_.field_2._M_allocated_capacity + 1);
    }
  }
  if (this_00 != (Mesh *)0x0) {
    (*(this_00->super_PointCloud)._vptr_PointCloud[1])(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> Decoder::DecodeMeshFromBuffer(
    DecoderBuffer *in_buffer) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
  return std::move(mesh);
}